

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O3

void replay_end(void)

{
  char **__ptr;
  long lVar1;
  nh_option_desc *pnVar2;
  char *name;
  long lVar3;
  
  if (loginfo.flog != (FILE *)0x0) {
    fclose((FILE *)loginfo.flog);
    loginfo.flog = (FILE *)0x0;
    lVar1 = get_tz_offset();
    if (lVar1 != replay_timezone) {
      log_timezone((int)lVar1);
    }
    name = saved_options->name;
    if (name != (char *)0x0) {
      lVar1 = 0x30;
      pnVar2 = saved_options;
      do {
        nh_set_option(name,pnVar2->value,'\0');
        pnVar2 = (nh_option_desc *)((long)&saved_options->name + lVar1);
        name = *(char **)((long)&saved_options->name + lVar1);
        lVar1 = lVar1 + 0x30;
      } while (name != (char *)0x0);
    }
    free_optlist(saved_options);
    saved_options = (nh_option_desc *)0x0;
    mfree(&diff_base);
    __ptr = commands;
    if (commands != (char **)0x0) {
      lVar1 = (long)cmdcount;
      if (1 < lVar1) {
        lVar3 = 1;
        do {
          free(__ptr[lVar3]);
          lVar3 = lVar3 + 1;
        } while (lVar1 != lVar3);
      }
      free(__ptr);
      commands = (char **)0x0;
    }
  }
  return;
}

Assistant:

void replay_end(void)
{
    int i;
    long tz_off;

    if (!loginfo.flog)
	return;

    fclose(loginfo.flog);
    loginfo.flog = 0;

    tz_off = get_tz_offset();
    if (tz_off != replay_timezone)
	log_timezone(tz_off);

    /* restore saved options */
    for (i = 0; saved_options[i].name; i++)
	nh_set_option(saved_options[i].name, saved_options[i].value, FALSE);
    free_optlist(saved_options);
    saved_options = NULL;

    mfree(&diff_base);

    if (!commands)
	return;
    
    for (i = 1; i < cmdcount; i++)
	free(commands[i]);
    free(commands);
    commands = NULL;
}